

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# centroidtracker.cpp
# Opt level: O2

rowCol * __thiscall
centroidtracker::getRowsCols
          (rowCol *__return_storage_ptr__,centroidtracker *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *D)

{
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  reference pvVar2;
  pointer pvVar3;
  int i;
  ulong __n;
  vector<int,_std::allocator<int>_> colResult;
  vector<int,_std::allocator<int>_> colTmp;
  vector<int,_std::allocator<int>_> rowResult;
  vector<double,_std::allocator<double>_> minValue;
  _Vector_base<int,_std::allocator<int>_> local_c8;
  _Vector_base<int,_std::allocator<int>_> local_a8;
  _Vector_base<int,_std::allocator<int>_> local_88;
  _Vector_base<double,_std::allocator<double>_> local_68;
  int local_48;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (pvVar3 = (D->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 != (D->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish; pvVar3 = pvVar3 + 1) {
    _Var1 = std::
            __min_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ((pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)&local_68,_Var1._M_current);
    _Var1 = std::
            __min_element<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ((pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start,
                       (pvVar3->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish);
    local_48 = (int)((ulong)((long)_Var1._M_current -
                            (long)(pvVar3->super__Vector_base<double,_std::allocator<double>_>).
                                  _M_impl.super__Vector_impl_data._M_start) >> 3);
    this = (centroidtracker *)&stack0xffffffffffffffb8;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_a8,&stack0xffffffffffffffb8);
  }
  argsort((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8,this,
          (vector<double,_std::allocator<double>_> *)&local_68);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            ((vector<int,_std::allocator<int>_> *)&local_88,
             (_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8);
  for (__n = 0; __n < (ulong)((long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_a8._M_impl.super__Vector_impl_data._M_start >> 2);
      __n = __n + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)&local_88,__n);
    pvVar2 = std::vector<int,_std::allocator<int>_>::at
                       ((vector<int,_std::allocator<int>_> *)&local_a8,(long)*pvVar2);
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_c8,pvVar2);
  }
  (__return_storage_ptr__->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->cols).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->rows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->cols,(vector<int,_std::allocator<int>_> *)&local_c8);
  std::vector<int,_std::allocator<int>_>::operator=
            (&__return_storage_ptr__->rows,(vector<int,_std::allocator<int>_> *)&local_88);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_c8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_a8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_68);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_88);
  return __return_storage_ptr__;
}

Assistant:

rowCol centroidtracker::getRowsCols(const std::vector<std::vector<double>> D) {
	std::vector<int> rowResult;
	std::vector<double> minValue;
	std::vector<int> colTmp;
	std::vector<int> colResult;
	for (auto iter = D.begin(); iter != D.end(); ++iter) {
		minValue.push_back(*std::min_element(iter->begin(), iter->end()));
		colTmp.push_back(std::min_element(iter->begin(), iter->end()) - iter->begin());
	}
	rowResult = argsort(minValue);

	for (int i = 0; i < colTmp.size(); ++i) {
		colResult.push_back(colTmp.at(rowResult.at(i)));
	}
	rowCol result;
	result.cols = colResult;
	result.rows = rowResult;

	return result;
}